

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_writer_utils.c
# Opt level: O0

int BitWriterResize(VP8BitWriter *bw,size_t extra_size)

{
  ulong size;
  ulong nmemb;
  void *__dest;
  long in_RSI;
  long in_RDI;
  size_t needed_size;
  uint64_t needed_size_64b;
  size_t new_size;
  uint8_t *new_buf;
  undefined4 local_4;
  
  size = *(long *)(in_RDI + 0x18) + in_RSI;
  if (*(ulong *)(in_RDI + 0x20) < size) {
    nmemb = *(long *)(in_RDI + 0x20) << 1;
    if (nmemb < size) {
      nmemb = size;
    }
    if (nmemb < 0x400) {
      nmemb = 0x400;
    }
    __dest = WebPSafeMalloc(nmemb,size);
    if (__dest == (void *)0x0) {
      *(undefined4 *)(in_RDI + 0x28) = 1;
      local_4 = 0;
    }
    else {
      if (*(long *)(in_RDI + 0x18) != 0) {
        memcpy(__dest,*(void **)(in_RDI + 0x10),*(size_t *)(in_RDI + 0x18));
      }
      WebPSafeFree((void *)0x18e09b);
      *(void **)(in_RDI + 0x10) = __dest;
      *(ulong *)(in_RDI + 0x20) = nmemb;
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int BitWriterResize(VP8BitWriter* const bw, size_t extra_size) {
  uint8_t* new_buf;
  size_t new_size;
  const uint64_t needed_size_64b = (uint64_t)bw->pos_ + extra_size;
  const size_t needed_size = (size_t)needed_size_64b;
  if (needed_size_64b != needed_size) {
    bw->error_ = 1;
    return 0;
  }
  if (needed_size <= bw->max_pos_) return 1;
  // If the following line wraps over 32bit, the test just after will catch it.
  new_size = 2 * bw->max_pos_;
  if (new_size < needed_size) new_size = needed_size;
  if (new_size < 1024) new_size = 1024;
  new_buf = (uint8_t*)WebPSafeMalloc(1ULL, new_size);
  if (new_buf == NULL) {
    bw->error_ = 1;
    return 0;
  }
  if (bw->pos_ > 0) {
    assert(bw->buf_ != NULL);
    memcpy(new_buf, bw->buf_, bw->pos_);
  }
  WebPSafeFree(bw->buf_);
  bw->buf_ = new_buf;
  bw->max_pos_ = new_size;
  return 1;
}